

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int glist_selectionindex(_glist *x,t_gobj *y,int selected)

{
  int iVar1;
  t_gobj *ptVar2;
  t_selection *ptVar3;
  int iVar4;
  
  ptVar2 = x->gl_list;
  iVar1 = 0;
  if (ptVar2 != y && ptVar2 != (t_gobj *)0x0) {
    iVar1 = 0;
    do {
      iVar4 = 0;
      if ((x->gl_editor != (t_editor *)0x0) &&
         (ptVar3 = x->gl_editor->e_selection, ptVar3 != (t_selection *)0x0)) {
        do {
          if (ptVar3->sel_what == ptVar2) {
            iVar4 = 1;
            goto LAB_0013be1d;
          }
          ptVar3 = ptVar3->sel_next;
        } while (ptVar3 != (_selection *)0x0);
        iVar4 = 0;
      }
LAB_0013be1d:
      iVar1 = iVar1 + (uint)(iVar4 == selected);
      ptVar2 = ptVar2->g_next;
    } while ((ptVar2 != (_gobj *)0x0) && (ptVar2 != y));
  }
  return iVar1;
}

Assistant:

int glist_selectionindex(t_glist *x, t_gobj *y, int selected)
{
    t_gobj *y2;
    int indx;

    for (y2 = x->gl_list, indx = 0; y2 && y2 != y; y2 = y2->g_next)
        if (selected == glist_isselected(x, y2))
            indx++;
    return (indx);
}